

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::UnaryAssertionExpr::serializeTo(UnaryAssertionExpr *this,ASTSerializer *serializer)

{
  string_view sVar1;
  
  sVar1 = ast::toString(this->op);
  ASTSerializer::write(serializer,2,"op",sVar1._M_len);
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  if ((this->range).super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::SequenceRange>._M_engaged == true) {
    SequenceRange::serializeTo((SequenceRange *)&this->range,serializer);
    return;
  }
  return;
}

Assistant:

void UnaryAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("expr", expr);
    if (range)
        range->serializeTo(serializer);
}